

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type *pTVar3;
  LogMessage *other;
  Type *pTVar4;
  int iVar5;
  int index;
  _Alloc_hider _Var6;
  undefined1 *puVar7;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  GLMRegressor lr;
  allocator_type local_101;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  Result *local_d8;
  string local_d0;
  undefined1 local_b0 [56];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  int local_50;
  Model *local_38;
  
  puVar7 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar7 == (ModelDescription *)0x0) {
    puVar7 = Specification::_ModelDescription_default_instance_;
  }
  local_78[0] = false;
  local_78[1] = false;
  local_78[2] = false;
  local_78[3] = false;
  validateRegressorInterface
            ((Result *)local_100,(ModelDescription *)puVar7,format->specificationversion_,
             (ValidationPolicy *)local_78);
  bVar2 = Result::good((Result *)local_100);
  if (bVar2) {
    local_d8 = __return_storage_ptr__;
    local_38 = format;
    if (0 < (((ModelDescription *)puVar7)->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_d0._M_dataplus._M_p = (pointer)0x500000002;
        local_d0._M_string_length._0_4_ = 1;
        __l._M_len = 3;
        __l._M_array = (iterator)&local_d0;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)local_b0,__l,&local_101);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(((ModelDescription *)puVar7)->input_).super_RepeatedPtrFieldBase,iVar5
                           );
        validateSchemaTypes((Result *)local_78,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)local_b0,pTVar3);
        local_100._4_4_ = local_78._4_4_;
        local_100._0_4_ = local_78._0_4_;
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_70);
        if (local_70._M_p != local_68 + 8) {
          operator_delete(local_70._M_p,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ - local_b0._0_8_);
        }
        bVar2 = Result::good((Result *)local_100);
        __return_storage_ptr__ = local_d8;
        if (!bVar2) goto LAB_0030aa87;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (((ModelDescription *)puVar7)->input_).super_RepeatedPtrFieldBase.
                       current_size_);
    }
    if (0 < (((ModelDescription *)puVar7)->output_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_d0._M_dataplus._M_p._0_4_ = 2;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_d0;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)local_b0,__l_00,&local_101);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(((ModelDescription *)puVar7)->output_).super_RepeatedPtrFieldBase,
                            iVar5);
        validateSchemaTypes((Result *)local_78,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)local_b0,pTVar3);
        local_100._4_4_ = local_78._4_4_;
        local_100._0_4_ = local_78._0_4_;
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_70);
        if (local_70._M_p != local_68 + 8) {
          operator_delete(local_70._M_p,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ - local_b0._0_8_);
        }
        bVar2 = Result::good((Result *)local_100);
        __return_storage_ptr__ = local_d8;
        if (!bVar2) goto LAB_0030aa87;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (((ModelDescription *)puVar7)->output_).super_RepeatedPtrFieldBase.
                       current_size_);
    }
    __return_storage_ptr__ = local_d8;
    if (local_38->_oneof_case_[0] == 300) {
      puVar7 = (undefined1 *)(local_38->Type_).glmregressor_;
    }
    else {
      puVar7 = Specification::_GLMRegressor_default_instance_;
    }
    Specification::GLMRegressor::GLMRegressor((GLMRegressor *)local_78,(GLMRegressor *)puVar7);
    if (local_68._8_4_ == local_50) {
      if (0 < (int)local_68._8_4_) {
        if ((int)local_68._8_4_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          other = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,other);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
        }
        if (1 < (int)local_68._8_4_) {
          iVar5 = *(int *)(*(long *)(local_68._16_8_ + 8) + 0x10);
          index = 1;
          do {
            pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                               ((RepeatedPtrFieldBase *)local_68,index);
            if ((pTVar4->value_).current_size_ != iVar5) {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"All weight coefficients must be the same size.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
              local_b0._16_8_ = local_d0.field_2._M_allocated_capacity;
              _Var6._M_p = local_d0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_0030abea;
              goto LAB_0030abf2;
            }
            index = index + 1;
          } while (index < (int)local_68._8_4_);
        }
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_b0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Weights and offsets must be the same size.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
      _Var6._M_p = (pointer)local_b0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b0 + 0x10)) {
LAB_0030abea:
        operator_delete(_Var6._M_p,(ulong)(local_b0._16_8_ + 1));
      }
    }
LAB_0030abf2:
    Specification::GLMRegressor::~GLMRegressor((GLMRegressor *)local_78);
  }
  else {
LAB_0030aa87:
    __return_storage_ptr__->m_type = local_100._0_4_;
    __return_storage_ptr__->m_reason = local_100._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p == &local_e8) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e8._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f8._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_f0;
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    local_f8._M_p = (pointer)&local_e8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }